

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares.c
# Opt level: O2

uint64_t aom_sum_squares_i16_c(int16_t *src,uint32_t n)

{
  uint64_t uVar1;
  long lVar2;
  
  lVar2 = 0;
  uVar1 = 0;
  do {
    uVar1 = uVar1 + (uint)((int)src[lVar2] * (int)src[lVar2]);
    lVar2 = lVar2 + 1;
  } while (n != (uint32_t)lVar2);
  return uVar1;
}

Assistant:

uint64_t aom_sum_squares_i16_c(const int16_t *src, uint32_t n) {
  uint64_t ss = 0;
  do {
    const int16_t v = *src++;
    ss += v * v;
  } while (--n);

  return ss;
}